

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

void js_dump_obj(JSContext *ctx,FILE *f,JSValue val)

{
  char *ptr;
  
  ptr = JS_ToCStringLen2(ctx,(size_t *)0x0,val,0);
  if (ptr != (char *)0x0) {
    fprintf((FILE *)f,"%s\n",ptr);
    JS_FreeCString(ctx,ptr);
    return;
  }
  fwrite("[exception]\n",0xc,1,(FILE *)f);
  return;
}

Assistant:

static void js_dump_obj(JSContext *ctx, FILE *f, JSValueConst val)
{
    const char *str;
    
    str = JS_ToCString(ctx, val);
    if (str) {
        fprintf(f, "%s\n", str);
        JS_FreeCString(ctx, str);
    } else {
        fprintf(f, "[exception]\n");
    }
}